

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdaptorTest.cpp
# Opt level: O3

void __thiscall
AdaptorTest_StackTest_Test::~AdaptorTest_StackTest_Test(AdaptorTest_StackTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AdaptorTest, StackTest) {
    std::stack<int, Deque<int>> s;
    for (int i = 0; i < 100; ++i) {
        s.push(i);
    }

    for (int i = 99; i >= 0; --i) {
        ASSERT_FALSE(s.empty());
        ASSERT_EQ(s.top(), i);
        s.pop();
    }
}